

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O1

void p2sc_dctm(double *m,int N)

{
  undefined1 auVar1 [16];
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  double __x;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  double dVar11;
  long lVar9;
  
  __x = (double)N;
  dVar11 = SQRT(__x);
  dVar6 = dVar11;
  if (__x < 0.0) {
    dVar6 = sqrt(__x);
    dVar11 = sqrt(__x);
  }
  auVar1 = _DAT_001c9f50;
  uVar5 = (ulong)(uint)N;
  if (0 < N) {
    lVar2 = uVar5 - 1;
    auVar7._8_4_ = (int)lVar2;
    auVar7._0_8_ = lVar2;
    auVar7._12_4_ = (int)((ulong)lVar2 >> 0x20);
    lVar2 = 0;
    auVar7 = auVar7 ^ _DAT_001c9f50;
    auVar8 = _DAT_001c9f40;
    do {
      auVar10 = auVar8 ^ auVar1;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        *(double *)((long)m + lVar2) = 1.0 / dVar6;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        *(double *)((long)m + lVar2 + 8) = 1.0 / dVar6;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(N + 1U >> 1) << 4 != lVar2);
  }
  if (1 < N) {
    pdVar3 = m + uVar5;
    uVar4 = 1;
    do {
      lVar2 = 0;
      do {
        dVar6 = cos(((double)((int)lVar2 + 1) * 3.141592653589793 * (double)(int)uVar4) /
                    (double)(N * 2));
        *(double *)((long)pdVar3 + lVar2 * 4) = dVar6 * (1.4142135623730951 / dVar11);
        lVar2 = lVar2 + 2;
      } while (uVar5 * 2 != lVar2);
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + uVar5;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void p2sc_dctm(double *m, int N) {
    int i, j;
    double s1 = 1 / sqrt(N), s2 = M_SQRT2 / sqrt(N);

    for (i = 0; i < N; ++i)
        m[i] = s1;
    for (j = 1; j < N; ++j)
        for (i = 0; i < N; ++i)
            m[j * N + i] = s2 * cos(M_PI * (2 * i + 1) * j / (2 * N));
}